

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlkq.cpp
# Opt level: O0

void __thiscall pg::ZLKQSolver::ZLKQSolver(ZLKQSolver *this,Oink *oink,Game *game)

{
  Game *game_local;
  Oink *oink_local;
  ZLKQSolver *this_local;
  
  Solver::Solver(&this->super_Solver,oink,game);
  (this->super_Solver)._vptr_Solver = (_func_int **)&PTR__ZLKQSolver_0029c570;
  this->iterations = 0;
  uintqueue::uintqueue(&this->Q);
  bitset::bitset(&this->W0);
  bitset::bitset(&this->W1);
  return;
}

Assistant:

ZLKQSolver::ZLKQSolver(Oink& oink, Game& game) : Solver(oink, game)
{
}